

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

Tim_Man_t * Gia_ManGenerateTim(int nPis,int nPos,int nBoxes,int nIns,int nOuts)

{
  int iVar1;
  Vec_Ptr_t *p;
  float *Entry;
  Tim_Man_t *p_00;
  Vec_Ptr_t *vDelayTables;
  int local_30;
  int curPo;
  int curPi;
  int i;
  Tim_Man_t *pMan;
  int nOuts_local;
  int nIns_local;
  int nBoxes_local;
  int nPos_local;
  int nPis_local;
  
  p = Vec_PtrAlloc(1);
  Entry = Gia_ManGenerateDelayTableFloat(nIns,nOuts);
  Vec_PtrPush(p,Entry);
  p_00 = Tim_ManStart(nPis + nOuts * nBoxes,nPos + nIns * nBoxes);
  Tim_ManSetDelayTables(p_00,p);
  vDelayTables._4_4_ = 0;
  local_30 = nPis;
  for (curPo = 0; curPo < nBoxes; curPo = curPo + 1) {
    Tim_ManCreateBox(p_00,vDelayTables._4_4_,nIns,local_30,nOuts,0,0);
    local_30 = nOuts + local_30;
    vDelayTables._4_4_ = nIns + vDelayTables._4_4_;
  }
  iVar1 = Tim_ManCiNum(p_00);
  if (local_30 == iVar1) {
    iVar1 = Tim_ManCoNum(p_00);
    if (nPos + vDelayTables._4_4_ == iVar1) {
      return p_00;
    }
    __assert_fail("curPo == Tim_ManCoNum(pMan)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                  ,0x285,"Tim_Man_t *Gia_ManGenerateTim(int, int, int, int, int)");
  }
  __assert_fail("curPi == Tim_ManCiNum(pMan)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                ,0x284,"Tim_Man_t *Gia_ManGenerateTim(int, int, int, int, int)");
}

Assistant:

Tim_Man_t * Gia_ManGenerateTim( int nPis, int nPos, int nBoxes, int nIns, int nOuts )
{
    Tim_Man_t * pMan;
    int i, curPi, curPo;
    Vec_Ptr_t * vDelayTables = Vec_PtrAlloc( 1 );
    Vec_PtrPush( vDelayTables, Gia_ManGenerateDelayTableFloat(nIns, nOuts) );
    pMan = Tim_ManStart( nPis + nOuts * nBoxes, nPos + nIns * nBoxes );
    Tim_ManSetDelayTables( pMan, vDelayTables );
    curPi = nPis;
    curPo = 0;
    for ( i = 0; i < nBoxes; i++ )
    {
        Tim_ManCreateBox( pMan, curPo, nIns, curPi, nOuts, 0, 0 );
        curPi += nOuts;
        curPo += nIns;
    }
    curPo += nPos;
    assert( curPi == Tim_ManCiNum(pMan) );
    assert( curPo == Tim_ManCoNum(pMan) );
    //Tim_ManPrint( pMan );
    return pMan;
}